

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_mlist(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BUFFER *buffer;
  MOB_INDEX_DATA *pMVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  if (local_2438[0] == '\0') {
    pcVar7 = "Syntax:  mlist <all/name>\n\r";
  }
  else {
    buffer = new_buf();
    pAVar2 = ch->in_room->area;
    bVar3 = str_cmp(local_2438,"all");
    bVar8 = false;
    if (pAVar2->max_vnum < pAVar2->min_vnum) {
      bVar3 = true;
    }
    else {
      iVar9 = 0;
      bVar8 = false;
      iVar10 = (int)pAVar2->min_vnum;
      do {
        pMVar6 = get_mob_index(0);
        if ((pMVar6 != (MOB_INDEX_DATA *)0x0) &&
           ((!bVar3 || (bVar4 = is_name(local_2438,pMVar6->player_name), bVar4)))) {
          sVar1 = pMVar6->vnum;
          pcVar7 = capitalize(pMVar6->short_descr);
          sprintf(local_1238,"[%5d] %-17.16s",(ulong)(uint)(int)sVar1,pcVar7);
          add_buf(buffer,local_1238);
          iVar5 = iVar9 * -0x55555555;
          iVar9 = iVar9 + 1;
          bVar8 = true;
          if (iVar5 + 0xd5555555U < 0x55555555) {
            add_buf(buffer,"\n\r");
          }
        }
        bVar4 = iVar10 < pAVar2->max_vnum;
        iVar10 = iVar10 + 1;
      } while (bVar4);
      bVar3 = iVar9 * -0x55555555 + 0x2aaaaaaaU < 0x55555555;
    }
    if (bVar8) {
      if (!bVar3) {
        add_buf(buffer,"\n\r");
      }
      pcVar7 = buf_string(buffer);
      page_to_char(pcVar7,ch);
      free_buf(buffer);
      return false;
    }
    pcVar7 = "Mobile(s) not found in this area.\n\r";
  }
  send_to_char(pcVar7,ch);
  return false;
}

Assistant:

bool redit_mlist(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool fAll, found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:  mlist <all/name>\n\r", ch);
		return false;
	}

	buf1 = new_buf();
	pArea = ch->in_room->area;
	/*    buf1[0] = '\0'; */
	fAll = !str_cmp(arg, "all");
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pMobIndex = get_mob_index(vnum);

		if (pMobIndex != nullptr)
		{
			if (fAll || is_name(arg, pMobIndex->player_name))
			{
				found = true;

				sprintf(buf, "[%5d] %-17.16s", pMobIndex->vnum, capitalize(pMobIndex->short_descr));
				add_buf(buf1, buf);

				if (++col % 3 == 0)
					add_buf(buf1, "\n\r");
			}
		}
	}

	if (!found)
	{
		send_to_char("Mobile(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}